

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

int helicsEndpointGetOption(HelicsEndpoint end,int option)

{
  EndpointObject *pEVar1;
  uint in_ESI;
  EndpointObject *endObj;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  HelicsEndpoint in_stack_ffffffffffffffd8;
  int local_4;
  
  pEVar1 = anon_unknown.dwarf_784a3::verifyEndpoint
                     (in_stack_ffffffffffffffd8,
                      (HelicsError *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (pEVar1 == (EndpointObject *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = (*(pEVar1->endPtr->super_Interface)._vptr_Interface[3])(pEVar1->endPtr,(ulong)in_ESI);
  }
  return local_4;
}

Assistant:

int helicsEndpointGetOption(HelicsEndpoint end, int option)
{
    auto* endObj = verifyEndpoint(end, nullptr);
    if (endObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        return endObj->endPtr->getOption(option);
    }
    // LCOV_EXCL_START
    catch (...) {
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}